

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_buffer_impl.cpp
# Opt level: O2

void __thiscall MppBufferService::~MppBufferService(MppBufferService *this)

{
  list_head *plVar1;
  list_head *plVar2;
  MppBufferGroupImpl *p;
  list_head *plVar3;
  MppAllocator (*papvVar4) [8];
  RK_U32 (*paRVar5) [5];
  long lVar6;
  long lVar7;
  
  this->finalizing = 1;
  if (this->misc_count != 0) {
    _mpp_log_l(4,"mpp_buffer","cleaning misc group\n","~MppBufferService");
    paRVar5 = this->misc;
    for (lVar7 = 0; lVar7 != 2; lVar7 = lVar7 + 1) {
      for (lVar6 = 0; lVar6 != 5; lVar6 = lVar6 + 1) {
        if ((*paRVar5)[lVar6] != 0) {
          p = get_group_by_id(this,(*paRVar5)[lVar6]);
          put_group(this,"~MppBufferService",p);
          (*paRVar5)[lVar6] = 0;
        }
      }
      paRVar5 = paRVar5 + 1;
    }
  }
  plVar1 = &this->mListGroup;
  if ((this->mListGroup).next != plVar1) {
    if (((byte)mpp_buffer_debug & 0x20) != 0) {
      dump(this,"leaked group found");
    }
    _mpp_log_l(4,"mpp_buffer","cleaning leaked group\n","~MppBufferService");
    plVar3 = plVar1->next;
    while (plVar3 != plVar1) {
      plVar2 = plVar3->next;
      put_group(this,"~MppBufferService",(MppBufferGroupImpl *)&plVar3[-0x11].prev);
      plVar3 = plVar2;
    }
  }
  plVar1 = &this->mListOrphan;
  if ((this->mListOrphan).next != plVar1) {
    _mpp_log_l(4,"mpp_buffer","cleaning leaked buffer\n","~MppBufferService");
    plVar3 = plVar1->next;
    while (plVar3 != plVar1) {
      plVar2 = plVar3->next;
      *(undefined4 *)&plVar3[-0xc].prev = 1;
      *(undefined4 *)&plVar3[-0xb].prev = 1;
      put_group(this,"~MppBufferService",(MppBufferGroupImpl *)&plVar3[-0x11].prev);
      plVar3 = plVar2;
    }
  }
  this->finished = 1;
  papvVar4 = this->mAllocator;
  for (lVar7 = 0; lVar7 != 5; lVar7 = lVar7 + 1) {
    for (lVar6 = 0; lVar6 != 0x40; lVar6 = lVar6 + 8) {
      if (*(long *)((long)*papvVar4 + lVar6) != 0) {
        mpp_allocator_put((MppAllocator *)((long)*papvVar4 + lVar6));
      }
    }
    papvVar4 = papvVar4 + 1;
  }
  return;
}

Assistant:

MppBufferService::~MppBufferService()
{
    RK_S32 i, j;

    finalizing = 1;

    // first remove legacy group which is the normal case
    if (misc_count) {
        mpp_log_f("cleaning misc group\n");
        for (i = 0; i < MPP_BUFFER_MODE_BUTT; i++)
            for (j = 0; j < MPP_BUFFER_TYPE_BUTT; j++) {
                RK_U32 id = misc[i][j];

                if (id) {
                    put_group(__FUNCTION__, get_group_by_id(id));
                    misc[i][j] = 0;
                }
            }
    }

    // then remove the remaining group which is the leak one
    if (!list_empty(&mListGroup)) {
        MppBufferGroupImpl *pos, *n;

        if (mpp_buffer_debug & MPP_BUF_DBG_DUMP_ON_EXIT)
            dump("leaked group found");

        mpp_log_f("cleaning leaked group\n");
        list_for_each_entry_safe(pos, n, &mListGroup, MppBufferGroupImpl, list_group) {
            put_group(__FUNCTION__, pos);
        }
    }

    // remove all orphan buffer group
    if (!list_empty(&mListOrphan)) {
        MppBufferGroupImpl *pos, *n;

        mpp_log_f("cleaning leaked buffer\n");

        list_for_each_entry_safe(pos, n, &mListOrphan, MppBufferGroupImpl, list_group) {
            pos->clear_on_exit = 1;
            pos->is_finalizing = 1;
            put_group(__FUNCTION__, pos);
        }
    }
    finished = 1;

    for (i = 0; i < MPP_BUFFER_TYPE_BUTT; i++) {
        for (j = 0; j < MPP_ALLOCATOR_WITH_FLAG_NUM; j++) {
            if (mAllocator[i][j])
                mpp_allocator_put(&(mAllocator[i][j]));
        }
    }
}